

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O1

void __thiscall
InterpreterTestSuite_PC_BrAdd_Test::~InterpreterTestSuite_PC_BrAdd_Test
          (InterpreterTestSuite_PC_BrAdd_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_BrAdd)
{
#define XPAN_1235 "0x1235"
#define XPAN_1236 "0x0000000000001236"

    TestContext ctx;
    InitContext(ctx);

    std::string brJson = "[\n\
    {\n\
        \"Addr\": \"1234::5679\",\n\
        \"Port\": 2001,\n\
        \"ThreadVersion\": \"th1.2\",\n\
        \"State\": 0,\n\
        \"NetworkName\": \"net2\",\n\
        \"ExtendedPanId\": \"" XPAN_1235 "\",\n\
        \"DomainName\": \"dom1\"\n\
    },\n\
    {\n\
        \"Addr\": \"1234::5670\",\n\
        \"Port\": 2000,\n\
        \"ThreadVersion\": \"th1.2\",\n\
        \"State\": 0,\n\
        \"NetworkName\": \"net2\",\n\
        \"ExtendedPanId\": \"" XPAN_1235 "\",\n\
        \"DomainName\": \"dom1\"\n\
    },\n\
    {\n\
        \"Addr\": \"1234::5671\",\n\
        \"Port\": 2001,\n\
        \"ThreadVersion\": \"th1.2\",\n\
        \"State\": 0,\n\
        \"NetworkName\": \"net3\",\n\
        \"ExtendedPanId\": \"" XPAN_1236 "\",\n\
        \"DomainName\": \"dom3\"\n\
    }\n\
]";

    Interpreter::Expression expr;
    Interpreter::Value      value;

    EXPECT_EQ(WriteFile(brJson, "./tmp/json.json"), Error{});
    expr  = ctx.mInterpreter.ParseExpression("br add ./tmp/json.json");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());

    BorderRouterArray brs;
    EXPECT_EQ(ctx.mInterpreter.mRegistry->GetAllBorderRouters(brs), RegistryStatus::kSuccess);
    EXPECT_EQ(brs.size(), 3);

    NetworkArray nwks;
    EXPECT_EQ(ctx.mInterpreter.mRegistry->GetAllNetworks(nwks), RegistryStatus::kSuccess);
    EXPECT_EQ(nwks.size(), 2);

    DomainArray doms;
    EXPECT_EQ(ctx.mInterpreter.mRegistry->GetAllDomains(doms), RegistryStatus::kSuccess);
    EXPECT_EQ(doms.size(), 2);

    Network  nwk;
    uint64_t xpan;
    EXPECT_EQ(utils::ParseInteger(xpan, "0x1235").GetCode(), ErrorCode::kNone);
    EXPECT_EQ(ctx.mInterpreter.mRegistry->GetNetworkByXpan(0x1235, nwk), RegistryStatus::kSuccess);
    EXPECT_EQ(nwk.mXpan, xpan);
    EXPECT_EQ(utils::ParseInteger(xpan, "0x0000000000001236").GetCode(), ErrorCode::kNone);
    EXPECT_EQ(ctx.mInterpreter.mRegistry->GetNetworkByXpan(0x1236, nwk), RegistryStatus::kSuccess);
    EXPECT_EQ(nwk.mXpan, xpan);
}